

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gensprep.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  undefined8 uVar2;
  UOption *pUVar3;
  FILE *pFVar4;
  int iVar5;
  uint length;
  int extraout_EAX;
  int iVar6;
  int extraout_EAX_00;
  int32_t length_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  EVP_PKEY_CTX *__s;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  undefined8 uVar14;
  UErrorCode *pErrorCode;
  EVP_PKEY_CTX *pEVar15;
  UErrorCode *pErrorCode_00;
  UStringPrepType type;
  EVP_PKEY_CTX *pEVar16;
  UErrorCode *versionString;
  UErrorCode errorCode;
  uint8_t auStackY_274 [4];
  UErrorCode *pUStackY_270;
  uint32_t uStackY_260;
  uint32_t uStackY_25c;
  ulong uStackY_258;
  char *pcStackY_250;
  uint32_t auStackY_248 [42];
  UErrorCode *pUStackY_1a0;
  char *pcStackY_198;
  char *pcStackY_190;
  char *pcStackY_188;
  EVP_PKEY_CTX *pEStackY_180;
  EVP_PKEY_CTX *pEStackY_178;
  byte bStackY_170;
  byte bStackY_16f;
  byte bStackY_16c;
  byte bStackY_16b;
  char *pcStackY_168;
  uint32_t auStackY_160 [42];
  UErrorCode *pUStackY_b8;
  char *pcStackY_b0;
  EVP_PKEY_CTX *pEStackY_a8;
  EVP_PKEY_CTX *pEStackY_a0;
  UErrorCode local_84;
  char *local_80;
  char *local_78 [9];
  
  local_84 = U_ZERO_ERROR;
  pEStackY_a0 = (EVP_PKEY_CTX *)0x109a7c;
  options[4].value = u_getDataDirectory_63();
  options[5].value = "";
  options[0xb].value = "0";
  options[7].value = "sprep";
  options[8].value = "";
  pEStackY_a0 = (EVP_PKEY_CTX *)0x109aca;
  iVar5 = u_parseArgs(argc,argv,0xc,options);
  pcVar12 = options[7].value;
  pcVar11 = options[5].value;
  if (iVar5 < 0) {
    pEStackY_a0 = (EVP_PKEY_CTX *)0x109d9d;
    fprintf(_stderr,"error in command line argument \"%s\"\n",argv[(uint)-iVar5]);
LAB_00109d65:
    iVar5 = printHelp(iVar5,argv);
    return iVar5;
  }
  if ((options[0].doesOccur != '\0') || (options[1].doesOccur != '\0')) goto LAB_00109d65;
  beVerbose = options[2].doesOccur;
  haveCopyright = options[3].doesOccur;
  pUVar3 = options + 8;
  if (options[8].doesOccur == '\0') {
    pUVar3 = options + 9;
  }
  if ((iVar5 < 2) || (options[0xb].doesOccur == '\0')) goto LAB_00109d65;
  local_80 = options[4].value;
  pcVar1 = pUVar3->value;
  pcVar13 = argv[1];
  if (options[6].doesOccur != '\0') {
    pEStackY_a0 = (EVP_PKEY_CTX *)0x109b73;
    u_setDataDirectory_63(options[6].value);
  }
  pEStackY_a0 = (EVP_PKEY_CTX *)0x109b7f;
  setUnicodeVersion(options[0xb].value);
  pEStackY_a0 = (EVP_PKEY_CTX *)0x109b87;
  sVar7 = strlen(pcVar11);
  pEStackY_a0 = (EVP_PKEY_CTX *)0x109b92;
  sVar8 = strlen(pcVar13);
  if (pcVar1 == (char *)0x0) {
    sVar9 = 0;
  }
  else {
    pEStackY_a0 = (EVP_PKEY_CTX *)0x109ba2;
    sVar9 = strlen(pcVar1);
  }
  pEStackY_a0 = (EVP_PKEY_CTX *)0x109bb6;
  __s = (EVP_PKEY_CTX *)uprv_malloc_63(sVar9 + sVar7 + sVar8 + 0x28);
  pEStackY_a0 = (EVP_PKEY_CTX *)0x109bc6;
  pcVar10 = strchr(pcVar11,0x2f);
  pEVar16 = __s;
  if (pcVar10 == (char *)0x0) {
    *(undefined2 *)__s = 0x2f2e;
    pEVar16 = __s + 2;
  }
  pEStackY_a0 = (EVP_PKEY_CTX *)0x109be0;
  strcpy((char *)pEVar16,pcVar11);
  pEStackY_a0 = (EVP_PKEY_CTX *)0x109be8;
  pEVar15 = __s;
  sVar7 = strlen((char *)__s);
  pEVar16 = __s + sVar7;
  if ((0 < (long)sVar7) && (pEVar16[-1] != (EVP_PKEY_CTX)0x2f)) {
    *pEVar16 = (EVP_PKEY_CTX)0x2f;
    pEVar16 = pEVar16 + 1;
  }
  pEStackY_a0 = (EVP_PKEY_CTX *)0x109c03;
  init(pEVar15);
  pEStackY_a0 = (EVP_PKEY_CTX *)0x109c0e;
  strcpy((char *)pEVar16,pcVar13);
  if (local_84 < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar14 = 0;
    pEStackY_a0 = (EVP_PKEY_CTX *)0x109c3f;
    u_parseDelimitedFile
              ((char *)__s,';',(char *(*) [2])local_78,3,strprepProfileLineFn,__s,&local_84);
    pErrorCode = (UErrorCode *)
                 CONCAT71((int7)((ulong)uVar14 >> 8),
                          local_84 == U_FILE_ACCESS_ERROR || local_84 < U_ILLEGAL_ARGUMENT_ERROR);
    if (local_84 == U_FILE_ACCESS_ERROR || local_84 < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_00109c54;
  }
  else {
LAB_00109c54:
    pFVar4 = _stderr;
    if (U_ZERO_ERROR < local_84) {
      pEStackY_a0 = (EVP_PKEY_CTX *)0x109db1;
      pcVar11 = u_errorName_63(local_84);
      pEStackY_a0 = (EVP_PKEY_CTX *)0x109dc8;
      fprintf(pFVar4,"Could not open file %s for reading. Error: %s \n",__s,pcVar11);
      return local_84;
    }
    if (options[8].doesOccur == '\0') {
      iVar5 = 0;
LAB_00109d1a:
      iVar6 = iVar5 + 2;
      if (options[10].doesOccur == '\0') {
        iVar6 = iVar5;
      }
      pEStackY_a0 = (EVP_PKEY_CTX *)0x109d2c;
      setOptions(iVar6);
      if (local_84 < U_ILLEGAL_ARGUMENT_ERROR) {
        pEStackY_a0 = (EVP_PKEY_CTX *)0x109d40;
        generateData(local_80,pcVar12);
        pEStackY_a0 = (EVP_PKEY_CTX *)0x109d45;
        cleanUpData();
      }
      pEStackY_a0 = (EVP_PKEY_CTX *)0x109d4d;
      uprv_free_63(__s);
      pEStackY_a0 = (EVP_PKEY_CTX *)0x109d52;
      u_cleanup_63();
      return local_84;
    }
    pEStackY_a0 = (EVP_PKEY_CTX *)0x109c78;
    strcpy((char *)__s,pcVar1);
    pEStackY_a0 = (EVP_PKEY_CTX *)0x109c80;
    sVar7 = strlen((char *)__s);
    pEVar15 = __s + sVar7;
    if ((0 < (long)sVar7) && (pEVar15[-1] != (EVP_PKEY_CTX)0x2f)) {
      *pEVar15 = (EVP_PKEY_CTX)0x2f;
      pEVar15 = pEVar15 + 1;
    }
    *pEVar15 = (EVP_PKEY_CTX)0x2f;
    *(undefined8 *)(pEVar15 + 1) = 0x7a696c616d726f4e;
    *(undefined8 *)(pEVar15 + 9) = 0x726f436e6f697461;
    *(undefined8 *)(pEVar15 + 0xe) = 0x6974636572726f43;
    *(undefined8 *)(pEVar15 + 0x16) = 0x7478742e736e6f;
    uVar14 = 0;
    pEStackY_a0 = (EVP_PKEY_CTX *)0x109cda;
    u_parseDelimitedFile
              ((char *)__s,';',(char *(*) [2])local_78,4,normalizationCorrectionsLineFn,(void *)0x0,
               &local_84);
    pErrorCode = (UErrorCode *)
                 CONCAT71((int7)((ulong)uVar14 >> 8),
                          local_84 == U_FILE_ACCESS_ERROR || local_84 < U_ILLEGAL_ARGUMENT_ERROR);
    if (local_84 == U_FILE_ACCESS_ERROR || local_84 < U_ILLEGAL_ARGUMENT_ERROR) {
      iVar5 = 1;
      if (U_ZERO_ERROR < local_84) {
        pEStackY_a0 = (EVP_PKEY_CTX *)0x109d16;
        fprintf(_stderr,"Could not open file %s for reading \n",__s);
        return local_84;
      }
      goto LAB_00109d1a;
    }
    pEStackY_a0 = (EVP_PKEY_CTX *)0x109dd7;
    main_cold_2();
  }
  pEStackY_a0 = (EVP_PKEY_CTX *)normalizationCorrectionsLineFn;
  pEVar15 = __s;
  main_cold_1();
  pcStackY_b0 = pcVar12;
  pEStackY_178 = (EVP_PKEY_CTX *)0x109e09;
  pErrorCode_00 = pErrorCode;
  pUStackY_b8 = &local_84;
  pEStackY_a8 = __s;
  pEStackY_a0 = pEVar16;
  pcVar11 = (char *)strtoul(*(char **)pEVar15,&pcStackY_168,0x10);
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    pEStackY_178 = (EVP_PKEY_CTX *)0x109e2b;
    pErrorCode_00 = pErrorCode;
    length = u_parseCodePoints(*(char **)(pEVar15 + 0x10),auStackY_160,0x28,pErrorCode);
    pEVar16 = (EVP_PKEY_CTX *)(ulong)length;
    pEStackY_178 = (EVP_PKEY_CTX *)0x109e39;
    u_versionFromString_63(&bStackY_170,*(char **)(pEVar15 + 0x30));
    pEStackY_178 = (EVP_PKEY_CTX *)0x109e4a;
    u_versionFromString_63(&bStackY_16c,"3.2.0");
    versionString = (UErrorCode *)(ulong)(uint)*pErrorCode;
    pcVar12 = pcVar11;
    if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      if ((bStackY_16c < bStackY_170) ||
         ((bStackY_170 == bStackY_16c && (bStackY_16b < bStackY_16f)))) {
        pEStackY_178 = (EVP_PKEY_CTX *)0x109e70;
        storeMapping((uint32_t)pcVar11,auStackY_160,length,USPREP_MAP,pErrorCode);
      }
      pEStackY_178 = (EVP_PKEY_CTX *)0x109e86;
      setUnicodeVersionNC(&bStackY_170);
      return extraout_EAX;
    }
  }
  else {
    pEStackY_178 = (EVP_PKEY_CTX *)0x109e9f;
    versionString = pErrorCode;
    normalizationCorrectionsLineFn_cold_2();
  }
  pEStackY_178 = (EVP_PKEY_CTX *)strprepProfileLineFn;
  pcVar11 = pcVar12;
  normalizationCorrectionsLineFn_cold_1();
  uStackY_25c = 0;
  uStackY_260 = 0;
  pUStackY_270 = (UErrorCode *)0x109ed6;
  pUStackY_1a0 = pErrorCode;
  pcStackY_198 = pcVar1;
  pcStackY_190 = pcVar13;
  pcStackY_188 = pcVar12;
  pEStackY_180 = pEVar15;
  pEStackY_178 = pEVar16;
  pcVar12 = u_skipWhitespace(*(char **)versionString);
  if (*pcVar12 == '@') {
    pcVar12 = pcVar12 + 1;
    iVar5 = versionString[2] - (int)pcVar12;
    if (8 < iVar5) {
      pUStackY_270 = (UErrorCode *)0x109f01;
      iVar6 = strncmp(pcVar12,"normalize",9);
      if (iVar6 == 0) {
        options[8].doesOccur = '\x01';
        return 0;
      }
    }
    if (9 < iVar5) {
      pUStackY_270 = (UErrorCode *)0x109f1e;
      iVar5 = strncmp(pcVar12,"check-bidi",10);
      if (iVar5 == 0) {
        options[10].doesOccur = '\x01';
        return 0;
      }
    }
    pUStackY_270 = (UErrorCode *)0x109f42;
    strprepProfileLineFn_cold_1();
  }
  pcVar1 = *(char **)(versionString + 4);
  pcVar13 = *(char **)(versionString + 8);
  pUStackY_270 = (UErrorCode *)0x109f59;
  pcVar10 = strstr(pcVar13,"UNASSIGNED");
  if (pcVar10 == (char *)0x0) {
    pUStackY_270 = (UErrorCode *)0x109f98;
    pcVar10 = strstr(pcVar13,"PROHIBITED");
    if (pcVar10 == (char *)0x0) {
      pUStackY_270 = (UErrorCode *)0x109ffc;
      pcVar13 = strstr(pcVar13,"MAP");
      if (pcVar13 == (char *)0x0) {
        *pErrorCode_00 = U_INVALID_FORMAT_ERROR;
        iVar5 = 0;
      }
      else {
        pUStackY_270 = (UErrorCode *)0x10a016;
        uStackY_258 = strtoul(pcVar12,&pcStackY_250,0x10);
        if ((pcStackY_250 <= pcVar12) || (pcStackY_250 != *(char **)(versionString + 2))) {
          pUStackY_270 = (UErrorCode *)0x10a0ca;
          strprepProfileLineFn_cold_4();
          pUStackY_270 = pErrorCode_00;
          u_versionFromString_63(auStackY_274,(char *)versionString);
          dataInfo.dataVersion[0] = auStackY_274[0];
          dataInfo.dataVersion[1] = auStackY_274[1];
          dataInfo.dataVersion[2] = auStackY_274[2];
          dataInfo.dataVersion[3] = auStackY_274[3];
          iVar5._0_1_ = auStackY_274[0];
          iVar5._1_1_ = auStackY_274[1];
          iVar5._2_1_ = auStackY_274[2];
          iVar5._3_1_ = auStackY_274[3];
          return iVar5;
        }
        pUStackY_270 = (UErrorCode *)0x10a04a;
        length_00 = u_parseCodePoints(pcVar1,auStackY_248,0x28,pErrorCode_00);
        pUStackY_270 = (UErrorCode *)0x10a061;
        storeMapping((uint32_t)uStackY_258,auStackY_248,length_00,USPREP_MAP,pErrorCode_00);
        iVar5 = extraout_EAX_01;
      }
      goto LAB_00109fd1;
    }
    pUStackY_270 = (UErrorCode *)0x109fb2;
    u_parseCodePointRange(pcVar12,&uStackY_25c,&uStackY_260,pErrorCode_00);
    if (U_ZERO_ERROR < *pErrorCode_00) {
      pUStackY_270 = (UErrorCode *)0x10a080;
      strprepProfileLineFn_cold_3();
      return extraout_EAX_03;
    }
    type = USPREP_PROHIBITED;
  }
  else {
    pUStackY_270 = (UErrorCode *)0x109f73;
    u_parseCodePointRange(pcVar12,&uStackY_25c,&uStackY_260,pErrorCode_00);
    if (U_ZERO_ERROR < *pErrorCode_00) {
      pUStackY_270 = (UErrorCode *)0x10a076;
      strprepProfileLineFn_cold_2();
      return extraout_EAX_02;
    }
    type = USPREP_UNASSIGNED;
  }
  pUStackY_270 = (UErrorCode *)0x109fd1;
  storeRange(uStackY_25c,uStackY_260,type,pErrorCode_00);
  iVar5 = extraout_EAX_00;
LAB_00109fd1:
  pFVar4 = _stderr;
  if (*pErrorCode_00 < U_ILLEGAL_ARGUMENT_ERROR) {
    return iVar5;
  }
  uVar14 = *(undefined8 *)versionString;
  uVar2 = *(undefined8 *)(versionString + 8);
  pUStackY_270 = (UErrorCode *)0x10a09b;
  pcVar12 = u_errorName_63(*pErrorCode_00);
  pUStackY_270 = (UErrorCode *)0x10a0b8;
  fprintf(pFVar4,"gensprep error parsing  %s line %s at %s. Error: %s\n",pcVar11,uVar14,uVar2,
          pcVar12);
  pUStackY_270 = (UErrorCode *)0x10a0bf;
  exit(*pErrorCode_00);
}

Assistant:

extern int
main(int argc, char* argv[]) {
#if !UCONFIG_NO_IDNA
    char* filename = NULL;
#endif
    const char *srcDir=NULL, *destDir=NULL, *icuUniDataDir=NULL;
    const char *bundleName=NULL, *inputFileName = NULL;
    char *basename=NULL;
    int32_t sprepOptions = 0;

    UErrorCode errorCode=U_ZERO_ERROR;

    U_MAIN_INIT_ARGS(argc, argv);

    /* preset then read command line options */
    options[DESTDIR].value=u_getDataDirectory();
    options[SOURCEDIR].value="";
    options[UNICODE_VERSION].value="0"; /* don't assume the unicode version */
    options[BUNDLE_NAME].value = DATA_NAME;
    options[NORMALIZE].value = "";

    argc=u_parseArgs(argc, argv, UPRV_LENGTHOF(options), options);

    /* error handling, printing usage message */
    if(argc<0) {
        fprintf(stderr,
            "error in command line argument \"%s\"\n",
            argv[-argc]);
    }
    if(argc<0 || options[HELP].doesOccur || options[HELP_QUESTION_MARK].doesOccur) {
        return printHelp(argc, argv);
        
    }

    /* get the options values */
    beVerbose=options[VERBOSE].doesOccur;
    haveCopyright=options[COPYRIGHT].doesOccur;
    srcDir=options[SOURCEDIR].value;
    destDir=options[DESTDIR].value;
    bundleName = options[BUNDLE_NAME].value;
    if(options[NORMALIZE].doesOccur) {
        icuUniDataDir = options[NORMALIZE].value;
    } else {
        icuUniDataDir = options[NORM_CORRECTION_DIR].value;
    }

    if(argc<2) {
        /* print the help message */
        return printHelp(argc, argv);
    } else {
        inputFileName = argv[1];
    }
    if(!options[UNICODE_VERSION].doesOccur){
        return printHelp(argc, argv);
    }
    if(options[ICUDATADIR].doesOccur) {
        u_setDataDirectory(options[ICUDATADIR].value);
    }
#if UCONFIG_NO_IDNA

    fprintf(stderr,
        "gensprep writes dummy " U_ICUDATA_NAME "_" DATA_NAME "." DATA_TYPE
        " because UCONFIG_NO_IDNA is set, \n"
        "see icu/source/common/unicode/uconfig.h\n");
    generateData(destDir, bundleName);

#else

    setUnicodeVersion(options[UNICODE_VERSION].value);
    filename = (char* ) uprv_malloc(uprv_strlen(srcDir) + uprv_strlen(inputFileName) + (icuUniDataDir == NULL ? 0 : uprv_strlen(icuUniDataDir)) + 40); /* hopefully this should be enough */
   
    /* prepare the filename beginning with the source dir */
    if(uprv_strchr(srcDir,U_FILE_SEP_CHAR) == NULL && uprv_strchr(srcDir,U_FILE_ALT_SEP_CHAR) == NULL){
        filename[0] = '.';
        filename[1] = U_FILE_SEP_CHAR;
        uprv_strcpy(filename+2,srcDir);
    }else{
        uprv_strcpy(filename, srcDir);
    }
    
    basename=filename+uprv_strlen(filename);
    if(basename>filename && *(basename-1)!=U_FILE_SEP_CHAR) {
        *basename++=U_FILE_SEP_CHAR;
    }
    
    /* initialize */
    init();

    /* process the file */
    uprv_strcpy(basename,inputFileName);
    parseMappings(filename,FALSE, &errorCode);
    if(U_FAILURE(errorCode)) {
        fprintf(stderr, "Could not open file %s for reading. Error: %s \n", filename, u_errorName(errorCode));
        return errorCode;
    }
    
    if(options[NORMALIZE].doesOccur){ /* this option might be set by @normalize;; in the source file */
        /* set up directory for NormalizationCorrections.txt */
        uprv_strcpy(filename,icuUniDataDir);
        basename=filename+uprv_strlen(filename);
        if(basename>filename && *(basename-1)!=U_FILE_SEP_CHAR) {
            *basename++=U_FILE_SEP_CHAR;
        }

        *basename++=U_FILE_SEP_CHAR;
        uprv_strcpy(basename,NORM_CORRECTIONS_FILE_NAME);
    
        parseNormalizationCorrections(filename,&errorCode);
        if(U_FAILURE(errorCode)){
            fprintf(stderr,"Could not open file %s for reading \n", filename);
            return errorCode;
        }
        sprepOptions |= _SPREP_NORMALIZATION_ON;
    }
    
    if(options[CHECK_BIDI].doesOccur){ /* this option might be set by @check-bidi;; in the source file */
        sprepOptions |= _SPREP_CHECK_BIDI_ON;
    }

    setOptions(sprepOptions);

    /* process parsed data */
    if(U_SUCCESS(errorCode)) {
        /* write the data file */
        generateData(destDir, bundleName);

        cleanUpData();
    }

    uprv_free(filename);

    u_cleanup();

#endif

    return errorCode;
}